

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicstransform.cpp
# Opt level: O0

void __thiscall QGraphicsTransformPrivate::setItem(QGraphicsTransformPrivate *this,QGraphicsItem *i)

{
  long lVar1;
  QGraphicsItemPrivate *pQVar2;
  QGraphicsItem *in_RSI;
  QGraphicsTransformPrivate *in_RDI;
  long in_FS_OFFSET;
  QGraphicsItemPrivate *d_ptr;
  QGraphicsTransform *q;
  QGraphicsTransform **in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDI->item != in_RSI) {
    if (in_RDI->item != (QGraphicsItem *)0x0) {
      q_func(in_RDI);
      pQVar2 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
               data(&in_RDI->item->d_ptr);
      QGraphicsItem::prepareGeometryChange(i);
      QList<QGraphicsTransform*>::removeAll<QGraphicsTransform*>
                ((QList<QGraphicsTransform_*> *)in_RDI,in_stack_ffffffffffffffc8);
      *(ulong *)&pQVar2->field_0x160 =
           *(ulong *)&pQVar2->field_0x160 & 0xffdfffffffffffff | 0x20000000000000;
      in_RDI->item = (QGraphicsItem *)0x0;
    }
    in_RDI->item = in_RSI;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsTransformPrivate::setItem(QGraphicsItem *i)
{
    if (item == i)
        return;

    if (item) {
        Q_Q(QGraphicsTransform);
        QGraphicsItemPrivate *d_ptr = item->d_ptr.data();

        item->prepareGeometryChange();
        Q_ASSERT(d_ptr->transformData);
        d_ptr->transformData->graphicsTransforms.removeAll(q);
        d_ptr->dirtySceneTransform = 1;
        item = nullptr;
    }

    item = i;
}